

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_bool>
* __thiscall
gtl::internal_btree::
btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>::
insert_unique<int>(pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_bool>
                   *__return_storage_ptr__,
                  btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                  *this,key_type *key,int *args)

{
  bool bVar1;
  node_type *pnVar2;
  btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
  *this_00;
  template_ElementType<2L> *ptVar3;
  int iVar4;
  undefined8 extraout_RDX;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  bVar5;
  iterator iVar6;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  iter;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  iter_00;
  pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_int>
  res;
  
  if (this->size_ == 0) {
    pnVar2 = new_leaf_root_node(this,1);
    this->rightmost_ = pnVar2;
    (this->root_).
    super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
    .
    super_Storage<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_2UL,_false>
    .value = pnVar2;
  }
  else {
    pnVar2 = (this->root_).
             super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
             .
             super_Storage<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_2UL,_false>
             .value;
  }
  bVar5._8_8_ = 0;
  bVar5.node = pnVar2;
  btree<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>::
  internal_locate_plain_compare<int,gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>,int&,int*>>
            (&res,(btree<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                   *)this,key,bVar5);
  if (res.second == 0) {
    iter_00.node = (btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                    *)(ulong)(uint)res.first.position;
    iter_00._8_8_ = extraout_RDX;
    bVar5 = btree<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
            ::
            internal_last<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>,int&,int*>>
                      ((btree<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                        *)res.first.node,iter_00);
    this_00 = (btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
               *)bVar5.node;
    if (this_00 !=
        (btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
         *)0x0) {
      iVar4 = bVar5.position;
      ptVar3 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
               ::GetField<2l>(this_00);
      if (ptVar3[iVar4].value <= *key) goto LAB_001f82ef;
    }
  }
  else if (res.second == 0x40000000) {
    iter.node = (btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                 *)(ulong)(uint)res.first.position;
    iter._8_8_ = extraout_RDX;
    bVar5 = btree<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
            ::
            internal_last<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>,int&,int*>>
                      ((btree<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                        *)res.first.node,iter);
    this_00 = (btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
               *)bVar5.node;
    iVar4 = bVar5.position;
LAB_001f82ef:
    bVar1 = false;
    goto LAB_001f82f1;
  }
  iVar6.position = res.first.position;
  iVar6.node = res.first.node;
  iVar6._12_4_ = 0;
  iVar6 = internal_emplace<int>(this,iVar6,args);
  this_00 = (btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
             *)iVar6.node;
  iVar4 = iVar6.position;
  bVar1 = true;
LAB_001f82f1:
  (__return_storage_ptr__->first).node =
       (btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
        *)this_00;
  (__return_storage_ptr__->first).position = iVar4;
  __return_storage_ptr__->second = bVar1;
  return __return_storage_ptr__;
}

Assistant:

auto btree<P>::insert_unique(const key_type &key, Args &&... args)
    -> std::pair<iterator, bool> {
  if (empty()) {
    mutable_root() = rightmost_ = new_leaf_root_node(1);
  }

  std::pair<iterator, int> res = internal_locate(key, iterator(root(), 0));
  iterator &iter = res.first;
  if (res.second == kExactMatch) {
    // The key already exists in the tree, do nothing.
    return std::make_pair(internal_last(iter), false);
  } else if (!res.second) {
    iterator last = internal_last(iter);
    if (last.node && !compare_keys(key, last.key())) {
      // The key already exists in the tree, do nothing.
      return std::make_pair(last, false);
    }
  }

  return std::make_pair(internal_emplace(iter, std::forward<Args>(args)...),
                        true);
}